

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O0

void __thiscall
jrtplib::RTCPCompoundPacketBuilder::~RTCPCompoundPacketBuilder(RTCPCompoundPacketBuilder *this)

{
  RTCPCompoundPacketBuilder *this_local;
  
  (this->super_RTCPCompoundPacket).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTCPCompoundPacketBuilder_00192828;
  if ((this->external & 1U) != 0) {
    (this->super_RTCPCompoundPacket).compoundpacket = (uint8_t *)0x0;
  }
  ClearBuildBuffers(this);
  std::__cxx11::
  list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ::~list(&this->apppackets);
  std::__cxx11::
  list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ::~list(&this->byepackets);
  SDES::~SDES(&this->sdes);
  Report::~Report(&this->report);
  RTCPCompoundPacket::~RTCPCompoundPacket(&this->super_RTCPCompoundPacket);
  return;
}

Assistant:

RTCPCompoundPacketBuilder::~RTCPCompoundPacketBuilder()
{
	if (external)
		compoundpacket = 0; // make sure RTCPCompoundPacket doesn't delete the external buffer
	ClearBuildBuffers();
}